

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testobject.cpp
# Opt level: O2

int talking_gvrtop_proc(Am_Object *self)

{
  int iVar1;
  ostream *poVar2;
  Am_Value *this;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"In Right formula.");
  std::endl<char,std::char_traits<char>>(poVar2);
  this = (Am_Value *)Am_Object::Get((ushort)self,0x2724);
  iVar1 = Am_Value::operator_cast_to_int(this);
  poVar2 = std::operator<<((ostream *)&std::cout,"Right Returns ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,".");
  std::endl<char,std::char_traits<char>>(poVar2);
  return iVar1;
}

Assistant:

Am_Define_Formula(int, talking_gvrtop)
{
  cout << "In Right formula." << endl;
  int top = self.Get(TOP);
  cout << "Right Returns " << top << "." << endl;
  return top;
}